

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O2

RowGroup * __thiscall
duckdb::SegmentTree<duckdb::RowGroup,_true>::GetSegment
          (SegmentTree<duckdb::RowGroup,_true> *this,idx_t row_number)

{
  RowGroup *pRVar1;
  SegmentLock l;
  unique_lock<std::mutex> uStack_28;
  
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->node_lock);
  pRVar1 = GetSegment(this,(SegmentLock *)&uStack_28,row_number);
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return pRVar1;
}

Assistant:

T *GetSegment(idx_t row_number) {
		auto l = Lock();
		return GetSegment(l, row_number);
	}